

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherwiseStatement.h
# Opt level: O2

void __thiscall OtherwiseStatement::execute(OtherwiseStatement *this,Environment *env)

{
  Environment local;
  
  (**((this->statement).super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_Statement)();
  return;
}

Assistant:

void execute(Environment *env) override {
        try {
            statement -> execute(env);
        } catch(ThrowPacket&) {
            Environment local = *env;
            statementBlock -> execute(&local);
        }
    }